

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_map.h
# Opt level: O1

void __thiscall
bloaty::sourcemap::SourceMapObjectFile::SourceMapObjectFile
          (SourceMapObjectFile *this,
          unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *file_data,
          string *build_id)

{
  InputFile *pIVar1;
  pointer pcVar2;
  
  pIVar1 = (file_data->_M_t).
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  (file_data->_M_t).
  super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
  super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
  super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl = (InputFile *)0x0;
  (this->super_ObjectFile).file_data_._M_t.
  super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
  super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
  super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl = pIVar1;
  (this->super_ObjectFile).debug_file_ = &this->super_ObjectFile;
  (this->super_ObjectFile)._vptr_ObjectFile = (_func_int **)&PTR__SourceMapObjectFile_0062e5c0;
  (this->build_id_)._M_dataplus._M_p = (pointer)&(this->build_id_).field_2;
  pcVar2 = (build_id->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->build_id_,pcVar2,pcVar2 + build_id->_M_string_length);
  return;
}

Assistant:

SourceMapObjectFile(std::unique_ptr<InputFile> file_data,
                      std::string build_id)
    : ObjectFile(std::move(file_data)), build_id_(build_id) {}